

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_strings.c
# Opt level: O0

char * cubeb_strings_intern(cubeb_strings *strings,char *s)

{
  cubeb_strings *in_RSI;
  char *in_RDI;
  char *is;
  cubeb_strings *in_stack_fffffffffffffff8;
  char *pcVar1;
  
  if ((in_RDI == (char *)0x0) || (in_RSI == (cubeb_strings *)0x0)) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = cubeb_strings_lookup(in_RSI,(char *)0x0);
    if (pcVar1 == (char *)0x0) {
      pcVar1 = cubeb_strings_push(in_stack_fffffffffffffff8,in_RDI);
    }
  }
  return pcVar1;
}

Assistant:

char const *
cubeb_strings_intern(cubeb_strings * strings, char const * s)
{
  char const * is = NULL;

  if (!strings || !s) {
    return NULL;
  }

  is = cubeb_strings_lookup(strings, s);
  if (is) {
    return is;
  }

  return cubeb_strings_push(strings, s);
}